

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O1

void cpu_wrdsp_mips64el(uint32_t rs,uint32_t mask_num,CPUMIPSState_conflict5 *env)

{
  target_ulong tVar1;
  uint uVar2;
  uint uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint8_t mask [6];
  
  tVar1 = (env->active_tc).DSPControl;
  lVar4 = 0;
  do {
    mask[lVar4] = (mask_num >> ((uint)lVar4 & 0x1f) & 1) != 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  uVar5 = rs & 0x7f;
  if (mask[0] != '\x01') {
    uVar5 = 0;
  }
  uVar6 = -(uint)(mask[0] != '\x01') | 0xffffff80;
  uVar8 = rs & 0x1f80;
  uVar3 = uVar6 & 0xffffe07f;
  if (mask[1] != '\x01') {
    uVar8 = 0;
    uVar3 = uVar6;
  }
  uVar6 = uVar3 & 0xffffdfff;
  uVar2 = rs & 0x2000;
  if (mask[2] != '\x01') {
    uVar6 = uVar3;
    uVar2 = 0;
  }
  uVar9 = rs & 0xff0000;
  uVar3 = uVar6 & 0xff00ffff;
  if (mask[3] != '\x01') {
    uVar9 = 0;
    uVar3 = uVar6;
  }
  uVar6 = uVar3 & 0xffffff;
  uVar7 = rs & 0xff000000;
  if (mask[4] != '\x01') {
    uVar6 = uVar3;
    uVar7 = 0;
  }
  uVar7 = uVar7 | uVar9 | uVar2 | uVar8 | uVar5;
  uVar3 = uVar6 & 0xffffbfff;
  uVar5 = rs & 0x4000 | uVar7;
  if (mask[5] != '\x01') {
    uVar3 = uVar6;
    uVar5 = uVar7;
  }
  (env->active_tc).DSPControl = (ulong)((uint)tVar1 & uVar3 | uVar5);
  return;
}

Assistant:

void cpu_wrdsp(uint32_t rs, uint32_t mask_num, CPUMIPSState *env)
{
    uint8_t  mask[6];
    uint8_t  i;
    uint32_t newbits, overwrite;
    target_ulong dsp;

    newbits   = 0x00;
    overwrite = 0xFFFFFFFF;
    dsp = env->active_tc.DSPControl;

    for (i = 0; i < 6; i++) {
        mask[i] = (mask_num >> i) & 0x01;
    }

    if (mask[0] == 1) {
#if defined(TARGET_MIPS64)
        overwrite &= 0xFFFFFF80;
        newbits   &= 0xFFFFFF80;
        newbits   |= 0x0000007F & rs;
#else
        overwrite &= 0xFFFFFFC0;
        newbits   &= 0xFFFFFFC0;
        newbits   |= 0x0000003F & rs;
#endif
    }

    if (mask[1] == 1) {
        overwrite &= 0xFFFFE07F;
        newbits   &= 0xFFFFE07F;
        newbits   |= 0x00001F80 & rs;
    }

    if (mask[2] == 1) {
        overwrite &= 0xFFFFDFFF;
        newbits   &= 0xFFFFDFFF;
        newbits   |= 0x00002000 & rs;
    }

    if (mask[3] == 1) {
        overwrite &= 0xFF00FFFF;
        newbits   &= 0xFF00FFFF;
        newbits   |= 0x00FF0000 & rs;
    }

    if (mask[4] == 1) {
        overwrite &= 0x00FFFFFF;
        newbits   &= 0x00FFFFFF;
#if defined(TARGET_MIPS64)
        newbits   |= 0xFF000000 & rs;
#else
        newbits   |= 0x0F000000 & rs;
#endif
    }

    if (mask[5] == 1) {
        overwrite &= 0xFFFFBFFF;
        newbits   &= 0xFFFFBFFF;
        newbits   |= 0x00004000 & rs;
    }

    dsp = dsp & overwrite;
    dsp = dsp | newbits;
    env->active_tc.DSPControl = dsp;
}